

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

line_status get_ppu_line_status(uint16_t scanline,uint16_t dot)

{
  line_status lVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  undefined1 local_15;
  uint16_t dot_local;
  uint16_t scanline_local;
  line_status status;
  
  _Var2 = is_visable_line(scanline);
  _Var3 = is_postrender_line(scanline);
  _Var4 = is_prerender_line(scanline);
  _Var5 = is_visable_dot(dot);
  _Var6 = is_shift_reload_dot_range(dot);
  _Var7 = is_reload_dot(dot);
  _Var8 = is_next_screen_fetch_dot(dot);
  local_15 = true;
  if (!_Var2) {
    local_15 = _Var4;
  }
  lVar1.postrender_line = _Var3;
  lVar1.visable_line = _Var2;
  lVar1.prerender_line = _Var4;
  lVar1.visable_dot = _Var5;
  lVar1.shift_reload_dot_range = _Var6;
  lVar1.shift_reload_dot = _Var7;
  lVar1.next_screen_dot = _Var8;
  lVar1.render_line = local_15;
  return lVar1;
}

Assistant:

static line_status get_ppu_line_status(uint16_t scanline, uint16_t dot) {
    line_status status;
    status.visable_line = is_visable_line(scanline);
    status.postrender_line = is_postrender_line(scanline);
    status.prerender_line = is_prerender_line(scanline);
    status.visable_dot = is_visable_dot(dot);
    status.shift_reload_dot_range = is_shift_reload_dot_range(dot);
    status.shift_reload_dot = is_reload_dot(dot);
    status.next_screen_dot = is_next_screen_fetch_dot(dot);
    status.render_line = status.visable_line || status.prerender_line;
    return status;
}